

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int lhCursorData(unqlite_kv_cursor *pCursor,_func_int_void_ptr_uint_void_ptr *xConsumer,
                void *pUserData)

{
  unqlite_kv_engine *puVar1;
  long *plVar2;
  ulong uVar3;
  bool bVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  lhash_kv_cursor *pCur;
  void *pvVar8;
  unqlite_kv_io *puVar9;
  unqlite_kv_io *puVar10;
  long *plStack_40;
  _func_int_void_ptr_uint_void_ptr *p_Stack_38;
  
  if ((*(int *)&pCursor[1].pStore != 2) ||
     (puVar1 = pCursor[2].pStore, puVar1 == (unqlite_kv_engine *)0x0)) {
    return -9;
  }
  if (puVar1[3].pIo == (unqlite_kv_io *)0x0) {
    iVar7 = (*xConsumer)((puVar1[4].pIo)->pMethods->zName +
                         (ulong)(*(int *)((long)&puVar1->pIo + 4) + 0x1a) +
                         (ulong)*(ushort *)&puVar1[5].pIo,*(uint *)&puVar1[1].pIo,pUserData);
    iVar5 = -10;
    if (iVar7 == 0) {
      iVar5 = 0;
    }
  }
  else {
    puVar10 = puVar1[1].pIo;
    puVar9 = puVar1[6].pIo;
    iVar5 = 0;
    if (puVar10 != (unqlite_kv_io *)0x0 && puVar9 != (unqlite_kv_io *)0x0) {
      plVar2 = (long *)(puVar1[4].pIo)->pHandle;
      bVar4 = true;
      p_Stack_38 = xConsumer;
      while (iVar5 = (*(code *)((undefined8 *)*plVar2)[2])
                               (*(undefined8 *)*plVar2,puVar9,&plStack_40), iVar5 == 0) {
        if (bVar4) {
          pvVar8 = (void *)(*plStack_40 + (ulong)*(ushort *)&puVar1[7].pIo);
          uVar6 = (int)plVar2[0x22] - (uint)*(ushort *)&puVar1[7].pIo;
        }
        else {
          pvVar8 = (void *)(*plStack_40 + 8);
          uVar6 = (int)plVar2[0x22] - 8;
        }
        puVar9 = (unqlite_kv_io *)(ulong)uVar6;
        if (puVar10 < puVar9 ||
            (unqlite_kv_io *)((long)puVar10 - (long)puVar9) == (unqlite_kv_io *)0x0) {
          iVar5 = (*p_Stack_38)(pvVar8,(uint)puVar10,pUserData);
          if (iVar5 != 0) goto LAB_00114fa2;
          puVar10 = (unqlite_kv_io *)0x0;
        }
        else if ((puVar9 != (unqlite_kv_io *)0x0) &&
                (iVar5 = (*p_Stack_38)(pvVar8,uVar6,pUserData),
                puVar10 = (unqlite_kv_io *)((long)puVar10 - (long)puVar9), iVar5 != 0)) {
LAB_00114fa2:
          (**(code **)(*plVar2 + 0x50))(plStack_40);
          return -10;
        }
        uVar3 = *(ulong *)*plStack_40;
        puVar9 = (unqlite_kv_io *)
                 (uVar3 >> 0x38 | (uVar3 & 0xff000000000000) >> 0x28 |
                  (uVar3 & 0xff0000000000) >> 0x18 | (uVar3 & 0xff00000000) >> 8 |
                  (uVar3 & 0xff000000) << 8 | (uVar3 & 0xff0000) << 0x18 | (uVar3 & 0xff00) << 0x28
                 | uVar3 << 0x38);
        (**(code **)(*plVar2 + 0x50))();
        bVar4 = false;
        if (puVar9 == (unqlite_kv_io *)0x0) {
          return 0;
        }
        if (puVar10 == (unqlite_kv_io *)0x0) {
          return 0;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int lhCursorData(unqlite_kv_cursor *pCursor,int (*xConsumer)(const void *,unsigned int,void *),void *pUserData)
{
	lhash_kv_cursor *pCur = (lhash_kv_cursor *)pCursor;
	lhcell *pCell;
	int rc;
	if( pCur->iState != L_HASH_CURSOR_STATE_CELL || pCur->pCell == 0 ){
		/* Invalid state */
		return UNQLITE_INVALID;
	}
	/* Point to the target cell */
	pCell = pCur->pCell;
	/* Consume the data */
	rc = lhConsumeCellData(pCell,xConsumer,pUserData);
	return rc;
}